

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TtManStop(Abc_TtMan_t *p)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar5 = 0;
  do {
    pVVar1 = p->vTtMem[lVar5];
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      pVVar3 = pVVar1->vTable;
      if (pVVar3 != (Vec_Int_t *)0x0) {
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar1->vTable->pArray = (int *)0x0;
          pVVar3 = pVVar1->vTable;
          if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_004b7632;
        }
        free(pVVar3);
        pVVar1->vTable = (Vec_Int_t *)0x0;
      }
LAB_004b7632:
      pVVar3 = pVVar1->vNexts;
      if (pVVar3 != (Vec_Int_t *)0x0) {
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar1->vNexts->pArray = (int *)0x0;
          pVVar3 = pVVar1->vNexts;
          if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_004b766e;
        }
        free(pVVar3);
        pVVar1->vNexts = (Vec_Int_t *)0x0;
      }
LAB_004b766e:
      pVVar1 = p->vTtMem[lVar5];
      if (pVVar1 != (Vec_Mem_t *)0x0) {
        iVar2 = pVVar1->iPage;
        if (-1 < iVar2) {
          lVar4 = -1;
          do {
            if (pVVar1->ppPages[lVar4 + 1] != (word *)0x0) {
              free(pVVar1->ppPages[lVar4 + 1]);
              pVVar1->ppPages[lVar4 + 1] = (word *)0x0;
              iVar2 = pVVar1->iPage;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < iVar2);
        }
        if (pVVar1->ppPages != (word **)0x0) {
          free(pVVar1->ppPages);
        }
        free(pVVar1);
        p->vTtMem[lVar5] = (Vec_Mem_t *)0x0;
      }
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 4) {
      free(p);
      return;
    }
  } while( true );
}

Assistant:

void Abc_TtManStop( Abc_TtMan_t * p )
{
    int i;
    for ( i = 0; i < TT_NUM_TABLES; i++ )
    {
        Vec_MemHashFree( p->vTtMem[i] );
        Vec_MemFreeP( &p->vTtMem[i] );
    }
    ABC_FREE( p );
}